

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O3

Face __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::removeInsertedVertex
          (SignpostIntrinsicTriangulation *this,Vertex v)

{
  bool bVar1;
  Etype firstE_;
  Vertex v_00;
  ParentMeshT *pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ParentMeshT *pPVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  Edge e;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> f;
  undefined1 auVar15 [16];
  Vertex local_e8;
  ulong local_d8;
  ulong local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  ParentMeshT *pPStack_c0;
  size_t sStack_b8;
  undefined1 uStack_b0;
  uint7 uStack_af;
  ParentMeshT *local_a8;
  size_t local_a0;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_98;
  undefined1 auVar16 [16];
  
  local_e8.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  local_e8.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
         mesh;
  if (((this->vertexLocations).data.
       super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
       .m_storage.m_data
       [local_e8.
        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind].
       type != Vertex) && (bVar5 = isOnFixedEdge(this,v), !bVar5)) {
    sVar7 = Vertex::degree(&local_e8);
    if (sVar7 != 3) {
      uVar9 = 0;
      do {
        local_c8 = (local_e8.
                    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .mesh)->useImplicitTwinFlag;
        sStack_b8 = ((local_e8.
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .mesh)->vHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_e8.
                     super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .ind];
        pPStack_c0 = local_e8.
                     super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .mesh;
        uStack_b0 = 0;
        local_a8 = local_e8.
                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
        firstE_._1_7_ = uStack_c7;
        firstE_.useImplicitTwin = (bool)local_c8;
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_e8.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = sStack_b8;
        firstE_._24_8_ = (ulong)uStack_af << 8;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_e8.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = sStack_b8;
        local_a0 = sStack_b8;
        NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::NavigationSetBase
                  (&local_98,firstE_);
        bVar4 = local_98.cachedEndIter.justStarted;
        bVar3 = local_98.cachedEndIter.state.currE.processingIncoming;
        pPVar2 = local_98.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
        bVar5 = local_98.firstE.useImplicitTwin;
        bVar6 = true;
        uVar10 = local_98.firstE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        pPVar11 = local_98.firstE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        uVar14 = local_98.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        bVar13 = local_98.firstE.processingIncoming;
        if ((local_98.firstE.useImplicitTwin & 1U) == 0) {
          do {
            bVar1 = pPVar11->useImplicitTwinFlag;
            if (bVar1 == true) {
              uVar12 = uVar10 & 0xfffffffffffffffe;
            }
            else {
              uVar12 = (pPVar11->eHalfedgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(pPVar11->heEdgeArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10]];
            }
            if (uVar10 == uVar12) goto LAB_001a15f6;
            if ((bVar13 & 1) == 0) {
              puVar8 = (pPVar11->heVertOutNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar10;
              if (bVar1 != false) {
                puVar8 = (pPVar11->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar10 ^ 1);
              }
              uVar10 = *puVar8;
              if (uVar10 == uVar14) {
                uVar12 = uVar14;
                do {
                  uVar10 = uVar12;
                  uVar12 = ((local_98.firstE.firstHe.
                             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heNextArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10];
                } while (uVar12 != uVar14);
                bVar13 = 1;
                pPVar11 = local_98.firstE.firstHe.
                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh;
                uVar14 = uVar10;
              }
            }
            else {
              if (bVar1 == false) {
                uVar10 = (pPVar11->heVertInNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10];
              }
              else {
                uVar10 = (pPVar11->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10] ^ 1;
              }
              if (uVar10 == uVar14) {
                bVar13 = 0;
                uVar10 = ((local_98.firstE.firstHe.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14];
                pPVar11 = local_98.firstE.firstHe.
                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh;
                uVar14 = uVar10;
              }
            }
          } while ((uVar10 != local_98.firstE.currHe.
                              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                              .ind) || ((bool)bVar13 != local_98.firstE.processingIncoming));
          bVar6 = false;
          uVar10 = local_98.firstE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        }
LAB_001a15f6:
        local_d0 = local_98.cachedEndIter.state.currE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        local_d8 = uVar9;
        while( true ) {
          if (((bVar6 == bVar4) && (uVar10 == local_d0)) && ((bool)bVar13 == bVar3)) {
            auVar15._0_8_ = SUB168(ZEXT816(0xffffffffffffffff) << 0x40,0);
            auVar15._8_8_ = SUB168(ZEXT816(0xffffffffffffffff) << 0x40,8);
            return (Face)auVar15;
          }
          if (pPVar11->useImplicitTwinFlag == true) {
            uVar9 = uVar10 >> 1;
          }
          else {
            uVar9 = (pPVar11->heEdgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
          }
          e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
               = uVar9;
          e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
          mesh = pPVar11;
          bVar6 = flipEdgeIfPossible(this,e,1e-06);
          if (bVar6) break;
          if ((bVar5 & 1U) == 0) {
            if ((bVar13 & 1) == 0) {
              puVar8 = (pPVar11->heVertOutNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar10;
              if (pPVar11->useImplicitTwinFlag != false) {
                puVar8 = (pPVar11->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar10 ^ 1);
              }
              uVar10 = *puVar8;
              if (uVar10 != uVar14) goto LAB_001a172f;
              uVar9 = uVar14;
              do {
                uVar10 = uVar9;
                uVar9 = (pPVar2->heNextArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
                if (uVar9 == uVar14) goto LAB_001a17dd;
              } while( true );
            }
            if (pPVar11->useImplicitTwinFlag == false) {
              uVar10 = (pPVar11->heVertInNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
            }
            else {
              uVar10 = (pPVar11->heNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10] ^ 1;
            }
            if (uVar10 != uVar14) goto LAB_001a172f;
LAB_001a1719:
            bVar13 = 0;
            uVar10 = (pPVar2->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
            pPVar11 = pPVar2;
            uVar14 = uVar10;
LAB_001a172f:
            do {
              bVar6 = pPVar11->useImplicitTwinFlag;
              do {
                while( true ) {
                  if (bVar6 == false) {
                    uVar9 = (pPVar11->eHalfedgeArr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [(pPVar11->heEdgeArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10]];
                  }
                  else {
                    uVar9 = uVar10 & 0xfffffffffffffffe;
                  }
                  if (uVar10 == uVar9) goto LAB_001a1696;
                  if ((bVar13 & 1) == 0) break;
                  if (bVar6 == false) {
                    uVar10 = (pPVar11->heVertInNextArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10];
                  }
                  else {
                    uVar10 = (pPVar11->heNextArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10] ^ 1;
                  }
                  if (uVar10 == uVar14) goto LAB_001a1719;
                }
                puVar8 = (pPVar11->heVertOutNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar10;
                if (bVar6 != false) {
                  puVar8 = (pPVar11->heNextArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + (uVar10 ^ 1);
                }
                uVar10 = *puVar8;
              } while (uVar10 != uVar14);
              uVar9 = uVar14;
              do {
                uVar10 = uVar9;
                uVar9 = (pPVar2->heNextArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
              } while (uVar9 != uVar14);
LAB_001a17dd:
              bVar13 = 1;
              pPVar11 = pPVar2;
              uVar14 = uVar10;
            } while( true );
          }
          puVar8 = (pPVar11->heVertOutNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10;
          if (pPVar11->useImplicitTwinFlag != false) {
            puVar8 = (pPVar11->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar10 ^ 1);
          }
          uVar10 = *puVar8;
LAB_001a1696:
          bVar6 = false;
        }
        sVar7 = Vertex::degree(&local_e8);
        if (sVar7 * 10 < local_d8) goto LAB_001a1847;
        uVar9 = local_d8 + 1;
        sVar7 = Vertex::degree(&local_e8);
      } while (sVar7 != 3);
    }
    sVar7 = Vertex::degree(&local_e8);
    if (sVar7 == 3) {
      v_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = local_e8.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind;
      v_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = local_e8.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
      f = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
          ManifoldSurfaceMesh::removeVertex
                    ((this->intrinsicMesh)._M_t.
                     super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                     .super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>.
                     _M_head_impl,v_00);
      updateFaceBasis(this,(Face)f);
      auVar16._0_8_ = f.mesh;
      auVar16._8_8_ = f.ind;
      return (Face)auVar16;
    }
  }
LAB_001a1847:
  return (Face)(Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               (ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

Face SignpostIntrinsicTriangulation::removeInsertedVertex(Vertex v) {
  // Strategy: flip edges until the vertex has degree three, then remove by replacing with a single face
  // TODO needs a proof that this always works... what about self edges, etc? Seems to work well.

  // What about starting with degree < 3? Since this vertex necessarily has angle sum 2PI, this could only happen in the
  // case of degree 2, with exactly degenerate triangles. Since we assume non-degenerate triangles throughout, we'll
  // consider that to not happen.

  if (vertexLocations[v].type == SurfacePointType::Vertex) return Face(); // can't remove original vertices

  if (isOnFixedEdge(v)) {
    return Face(); // don't try to remove boundary vertices, for now at least
  }

  // Flip edges until
  size_t iterCount = 0;
  while (v.degree() != 3) {

    // Find any edge we can flip
    bool anyFlipped = false;
    for (Edge e : v.adjacentEdges()) {
      anyFlipped = flipEdgeIfPossible(e);
      if (anyFlipped) break;
    }

    // failsafe, in case we get numerically stuck, or there are too many fixed edges (or the algorithm is broken)
    if (!anyFlipped || iterCount > 10 * v.degree()) {
      return Face();
    }

    iterCount++;
  }

  // give up if something went wrong (eg. flipped edges)
  if (v.degree() != 3) return Face();

  // Remove the vertex
  Face newF = intrinsicMesh->removeVertex(v);
  updateFaceBasis(newF);
  return newF;
}